

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

bool __thiscall
absl::container_internal::
btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
::is_root(btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
          *this)

{
  bool bVar1;
  btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
  *this_00;
  
  this_00 = parent(this);
  bVar1 = is_leaf(this_00);
  return bVar1;
}

Assistant:

bool is_root() const { return parent()->is_leaf(); }